

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  QDebug QVar1;
  bool bVar2;
  int iVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  QArrayData *local_d8;
  undefined8 *local_d0;
  ChangeInFlight local_c0 [6];
  char *local_a8;
  QDebug local_a0;
  undefined1 local_98 [8];
  QDebug local_90;
  QModelIndex local_88;
  anon_union_24_3_e3d07ef4_for_data local_70;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0[0] = None;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_c0,"changeInFlight","ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x313);
  if (bVar2) {
    this->changeInFlight = ColumnsRemoved;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_c0[0] = ColumnsMoved;
      local_c0[1] = None;
      local_c0[2] = None;
      local_c0[3] = None;
      local_c0[4] = None;
      local_c0[5] = 0;
      local_a8 = lcModelTest::category.name;
      QMessageLogger::debug();
      QVar1.stream = local_a0.stream;
      QVar5.m_data = (storage_type *)0x17;
      QVar5.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      QVar1.stream = local_a0.stream;
      QVar6.m_data = (storage_type *)0x6;
      QVar6.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_a0.stream,first);
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      QVar1.stream = local_a0.stream;
      QVar7.m_data = (storage_type *)0x4;
      QVar7.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_a0.stream,last);
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      QVar1.stream = local_a0.stream;
      QVar8.m_data = (storage_type *)0x7;
      QVar8.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
      }
      *(int *)((QTextStream *)local_a0.stream + 0x28) =
           *(int *)((QTextStream *)local_a0.stream + 0x28) + 1;
      operator<<((Stream *)(local_98 + 8),(QModelIndex *)local_98);
      QVar1.stream = local_90.stream;
      QVar9.m_data = (storage_type *)0xc;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x90))(&local_50,pQVar4,parent,0);
      QVariant::toString();
      if (local_d0 == (undefined8 *)0x0) {
        local_d0 = &QString::_empty;
      }
      QDebug::putString((QChar *)(local_98 + 8),(ulong)local_d0);
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      QVar1.stream = local_90.stream;
      QVar10.m_data = (storage_type *)0x18;
      QVar10.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_70);
      if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_70._0_8_ = *(int *)local_70._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_70._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_70._0_8_,2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      pQVar4 = (this->model).wp.value;
      iVar3 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,parent);
      QTextStream::operator<<((QTextStream *)local_90.stream,iVar3);
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      QVar1.stream = local_90.stream;
      QVar11.m_data = (storage_type *)0x14;
      QVar11.m_size = (qsizetype)&local_70;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_70);
      if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_70._0_8_ = *(int *)local_70._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_70._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_70._0_8_,2,0x10);
        }
      }
      if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_90.stream,' ');
      }
      *(int *)((QTextStream *)local_90.stream + 0x28) =
           *(int *)((QTextStream *)local_90.stream + 0x28) + 1;
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_f0,pQVar4,first + -1,0,parent);
      operator<<((QDebug)&local_88.i,(QModelIndex *)(local_98 + 0x10));
      iVar3 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_108,pQVar4,first + -1,0,parent);
      if (iVar3 == 0) {
        pQVar4 = (QObject *)0x0;
      }
      (**(code **)(*(long *)pQVar4 + 0x90))(&local_70,pQVar4,local_108,0);
      operator<<((QDebug *)&local_88.m,(QVariant *)&local_88.i);
      QDebug::~QDebug((QDebug *)&local_88.m);
      QVariant::~QVariant((QVariant *)&local_70);
      QDebug::~QDebug((QDebug *)&local_88.i);
      QDebug::~QDebug((QDebug *)(local_98 + 0x10));
      if (local_d8 != (QArrayData *)0x0) {
        LOCK();
        (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_d8,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_50);
      QDebug::~QDebug((QDebug *)(local_98 + 8));
      QDebug::~QDebug((QDebug *)local_98);
      QDebug::~QDebug(&local_a0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int first,
                                                              int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::ColumnsRemoved;

    qCDebug(lcModelTest) << "columnsAboutToBeRemoved"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(first - 1, 0, parent)
                         << model->data(model->index(first - 1, 0, parent));
}